

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

int nni_setopt(nni_option *opts,char *nm,void *arg,void *buf,size_t sz,nni_type otype)

{
  int iVar1;
  _func_int_void_ptr_void_ptr_size_t_nni_type **pp_Var2;
  
  pp_Var2 = &opts->o_set;
  while( true ) {
    if (((nni_option *)(pp_Var2 + -2))->o_name == (char *)0x0) {
      return 9;
    }
    iVar1 = strcmp(((nni_option *)(pp_Var2 + -2))->o_name,nm);
    if (iVar1 == 0) break;
    pp_Var2 = pp_Var2 + 3;
  }
  if (*pp_Var2 == (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
    return 0x18;
  }
  iVar1 = (**pp_Var2)(arg,buf,sz,otype);
  return iVar1;
}

Assistant:

int
nni_setopt(const nni_option *opts, const char *nm, void *arg, const void *buf,
    size_t sz, nni_type otype)
{
	while (opts->o_name != NULL) {
		if (strcmp(opts->o_name, nm) == 0) {
			if (opts->o_set == NULL) {
				return (NNG_EREADONLY);
			}
			return (opts->o_set(arg, buf, sz, otype));
		}
		opts++;
	}
	return (NNG_ENOTSUP);
}